

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

hwaddr S1_ptw_translate(CPUARMState_conflict *env,ARMMMUIdx mmu_idx,hwaddr addr,MemTxAttrs txattrs,
                       ARMMMUFaultInfo_conflict1 *fi)

{
  ulong uVar1;
  _Bool _Var2;
  ARMCacheAttrs cacheattrs;
  MemTxAttrs txattrs_local;
  hwaddr s2pa;
  int s2prot;
  target_ulong s2size;
  
  if ((mmu_idx - ARMMMUIdx_Stage1_E0 < 3) &&
     (txattrs_local = txattrs, _Var2 = regime_translation_disabled(env,ARMMMUIdx_Stage2), !_Var2)) {
    cacheattrs = (ARMCacheAttrs)0x0;
    uVar1 = (env->cp15).hcr_el2;
    _Var2 = get_phys_addr_lpae(env,addr,MMU_DATA_LOAD,ARMMMUIdx_Stage2,&s2pa,&txattrs_local,&s2prot,
                               &s2size,fi,
                               (ARMCacheAttrs *)((long)(uVar1 << 0x3d) >> 0x3f & (ulong)&cacheattrs)
                              );
    if (_Var2) {
      if (fi->type == ARMFault_None) {
        __assert_fail("fi->type != ARMFault_None",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                      ,0x247c,
                      "hwaddr S1_ptw_translate(CPUARMState *, ARMMMUIdx, hwaddr, MemTxAttrs, ARMMMUFaultInfo *)"
                     );
      }
    }
    else {
      if ((uVar1 & 4) == 0) {
        return s2pa;
      }
      if (((uint)cacheattrs & 0xf0) != 0) {
        return s2pa;
      }
      fi->type = ARMFault_Permission;
    }
    fi->s2addr = addr;
    fi->stage2 = true;
    fi->s1ptw = true;
    addr = 0xffffffffffffffff;
  }
  return addr;
}

Assistant:

static hwaddr S1_ptw_translate(CPUARMState *env, ARMMMUIdx mmu_idx,
                               hwaddr addr, MemTxAttrs txattrs,
                               ARMMMUFaultInfo *fi)
{
    if (arm_mmu_idx_is_stage1_of_2(mmu_idx) &&
        !regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
        target_ulong s2size;
        hwaddr s2pa;
        int s2prot;
        int ret;
        ARMCacheAttrs cacheattrs = { 0 };
        ARMCacheAttrs *pcacheattrs = NULL;

        if (env->cp15.hcr_el2 & HCR_PTW) {
            /*
             * PTW means we must fault if this S1 walk touches S2 Device
             * memory; otherwise we don't care about the attributes and can
             * save the S2 translation the effort of computing them.
             */
            pcacheattrs = &cacheattrs;
        }

        ret = get_phys_addr_lpae(env, addr, 0, ARMMMUIdx_Stage2, &s2pa,
                                 &txattrs, &s2prot, &s2size, fi, pcacheattrs);
        if (ret) {
            assert(fi->type != ARMFault_None);
            fi->s2addr = addr;
            fi->stage2 = true;
            fi->s1ptw = true;
            return ~0;
        }
        if (pcacheattrs && (pcacheattrs->attrs & 0xf0) == 0) {
            /* Access was to Device memory: generate Permission fault */
            fi->type = ARMFault_Permission;
            fi->s2addr = addr;
            fi->stage2 = true;
            fi->s1ptw = true;
            return ~0;
        }
        addr = s2pa;
    }
    return addr;
}